

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::RE2::MaxSubmatch(StringPiece *rewrite)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  StringPiece *in_RDI;
  int n;
  int c;
  char *end;
  char *s;
  int max;
  int local_34;
  char *local_18;
  int local_c;
  
  local_c = 0;
  local_18 = StringPiece::data(in_RDI);
  sVar2 = StringPiece::size(in_RDI);
  pcVar3 = local_18 + sVar2;
  for (; local_18 < pcVar3; local_18 = local_18 + 1) {
    if (*local_18 == '\\') {
      local_18 = local_18 + 1;
      if (local_18 < pcVar3) {
        local_34 = (int)*local_18;
      }
      else {
        local_34 = -1;
      }
      iVar1 = isdigit(local_34);
      if ((iVar1 != 0) && (local_c < local_34 + -0x30)) {
        local_c = local_34 + -0x30;
      }
    }
  }
  return local_c;
}

Assistant:

int RE2::MaxSubmatch(const StringPiece& rewrite) {
  int max = 0;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s == '\\') {
      s++;
      int c = (s < end) ? *s : -1;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n > max)
          max = n;
      }
    }
  }
  return max;
}